

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZHelpers.cpp
# Opt level: O0

void s_send_padding(socket_t *socket,string_view trace,int flags)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  char *__lhs;
  char local_71;
  allocator<char> *in_stack_ffffffffffffff90;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  string local_50 [12];
  int in_stack_ffffffffffffffbc;
  socket_t *in_stack_ffffffffffffffc0;
  string_view in_stack_ffffffffffffffc8;
  
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&stack0xffffffffffffffd0);
  bVar1 = s_send_raw(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffbc);
  if (!bVar1) {
    __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            __cxa_allocate_exception(0x10);
    __lhs = &local_71;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    std::operator+(__lhs,__rhs);
    std::runtime_error::runtime_error((runtime_error *)__rhs,local_50);
    __cxa_throw(__rhs,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

void s_send_padding(zmq::socket_t *socket, std::string_view trace, int flags) {
    if (!s_send_raw(socket, std::string_view{}, flags)) {
        throw std::runtime_error("s_send_padding failed:" + std::string(trace));
    }
}